

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::sort_stmts(Generator *top)

{
  undefined1 local_58 [8];
  SortStmtVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  SortStmtVisitor::SortStmtVisitor((SortStmtVisitor *)local_58);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  SortStmtVisitor::~SortStmtVisitor((SortStmtVisitor *)local_58);
  return;
}

Assistant:

void sort_stmts(Generator* top) {
    SortStmtVisitor visitor;
    visitor.visit_generator_root_p(top);
}